

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

CanonicalSet * __thiscall
parser::Parser::items
          (CanonicalSet *__return_storage_ptr__,Parser *this,Grammar *grammar,
          UniqueGrammaticSymbols *uniqueGrammaticSymbols)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *grammaticSymbol;
  bool bVar2;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  _Var3;
  _Base_ptr p_Var4;
  pointer pCVar5;
  long lVar6;
  CanonicalSet t;
  Situations situations;
  Situation start;
  Situations goToSituation;
  int local_fc;
  vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> local_f8;
  CanonicalItem local_d8;
  UniqueGrammaticSymbols *local_b8;
  Grammar *local_b0;
  vector<parser::Situation,_std::allocator<parser::Situation>_> local_a8;
  pointer local_88;
  Parser *local_80;
  value_type local_78;
  Situations local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ =
       local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_ & 0xffffff00;
  local_b8 = uniqueGrammaticSymbols;
  local_b0 = grammar;
  local_80 = this;
  common::make_vector<parser::GrammaticSymbol>::make_vector
            ((make_vector<parser::GrammaticSymbol> *)&local_f8,(GrammaticSymbol *)&local_48);
  std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::vector
            ((vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)&local_d8,
             (vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)&local_f8)
  ;
  local_78.super_Convolution._vptr_Convolution = (_func_int **)&PTR_stringify_00128ba8;
  local_78.super_Convolution.header = 0;
  std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::vector
            (&local_78.super_Convolution.body,
             (vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)&local_d8)
  ;
  local_78.super_Convolution._vptr_Convolution = (_func_int **)&PTR_stringify_00128b60;
  local_78.point = 0;
  if (local_d8.terminal != (GrammaticSymbol)0x0) {
    operator_delete((void *)local_d8.terminal,
                    (long)local_d8.situations.
                          super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_d8.terminal);
  }
  if (local_f8.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back(&local_a8,&local_78)
  ;
  closure(&local_a8,local_b0,&local_78);
  local_d8.terminal.value = -1;
  local_d8.terminal.isTerminal = true;
  local_d8.terminal._5_3_ = 0;
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
            (&local_d8.situations,&local_a8);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
  emplace_back<parser::CanonicalItem>(__return_storage_ptr__,&local_d8);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_d8.situations);
  p_Var1 = &(local_b8->_M_t)._M_impl.super__Rb_tree_header;
  do {
    local_f8.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
    _M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_f8.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
    _M_impl.super__Vector_impl_data._M_finish = (CanonicalItem *)0x0;
    local_f8.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar5 = (__return_storage_ptr__->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    bVar2 = false;
    if (pCVar5 != (__return_storage_ptr__->
                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_fc = 0;
      do {
        p_Var4 = (local_b8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_88 = pCVar5;
        if ((_Rb_tree_header *)p_Var4 != p_Var1) {
          do {
            grammaticSymbol = p_Var4 + 1;
            goTo(&local_48,local_80,local_b0,&pCVar5->situations,(GrammaticSymbol *)grammaticSymbol)
            ;
            if ((pointer)CONCAT44(local_48.
                                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_48.
                                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                       ._M_impl.super__Vector_impl_data._M_start) !=
                local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              _Var3 = std::
                      __find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,__gnu_cxx::__ops::_Iter_pred<parser::Pred>>
                                ((__return_storage_ptr__->
                                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                 )._M_impl.super__Vector_impl_data._M_start,
                                 (__return_storage_ptr__->
                                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                 )._M_impl.super__Vector_impl_data._M_finish,&local_48);
              if (_Var3._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
                _Var3 = std::
                        __find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,__gnu_cxx::__ops::_Iter_pred<parser::Pred>>
                                  (local_f8.
                                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   local_f8.
                                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_48);
                if (_Var3._M_current ==
                    local_f8.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_d8.terminal.value = grammaticSymbol->_M_color;
                  local_d8.terminal.isTerminal = (bool)grammaticSymbol->field_0x4;
                  local_d8.terminal._5_3_ = *(undefined3 *)&grammaticSymbol->field_0x5;
                  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
                            (&local_d8.situations,&local_48);
                  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
                  emplace_back<parser::CanonicalItem>(&local_f8,&local_d8);
                  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                            (&local_d8.situations);
                  local_fc = local_fc + 1;
                }
              }
            }
            std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          } while ((_Rb_tree_header *)p_Var4 != p_Var1);
        }
        pCVar5 = local_88 + 1;
      } while (pCVar5 != (__return_storage_ptr__->
                         super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      bVar2 = 0 < local_fc;
    }
    lVar6 = (long)local_f8.
                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.
                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      pCVar5 = local_f8.
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::push_back
                  (__return_storage_ptr__,pCVar5);
        pCVar5 = pCVar5 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector(&local_f8);
  } while (bVar2);
  local_78.super_Convolution._vptr_Convolution = (_func_int **)&PTR_stringify_00128ba8;
  if (local_78.super_Convolution.body.
      super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super_Convolution.body.
                    super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super_Convolution.body.
                          super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super_Convolution.body.
                          super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

CanonicalSet items(Grammar const& grammar, UniqueGrammaticSymbols const& uniqueGrammaticSymbols) {
            CanonicalSet canonicalSet;

            Situations situations;
            Situation start(StartNonTerminal, MakeGrammaticSymbols(GrammaticSymbol(InitialNonTerminal, false)));
            situations.push_back(start);
            closure(situations, grammar, start);

            canonicalSet.push_back(CanonicalItem(GrammaticSymbol(lexer::InvalidToken), situations));

            int itemAdded;
            do {
                itemAdded = 0;
                CanonicalSet t;
                for_each(CanonicalSet, canonicalSet, canonicalItem) {
                    for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                        Situations goToSituation = goTo(grammar, canonicalItem->situations, *symbol);
                        if (goToSituation.empty())
                            continue;
                        if (std::find_if(canonicalSet.begin(), canonicalSet.end(), Pred(goToSituation)) == canonicalSet.end() &&
                            std::find_if(t.begin(), t.end(), Pred(goToSituation)) == t.end()) {
                            t.push_back(CanonicalItem(*symbol, goToSituation));
                            itemAdded++;
                        }
                    }
                }
                std::copy(t.begin(), t.end(), std::back_inserter(canonicalSet));
            } while (itemAdded > 0);

            return canonicalSet;
        }